

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall.c
# Opt level: O3

void * metacallfms(void *func,char *buffer,size_t size,void *allocator)

{
  type_id tVar1;
  type_id tVar2;
  int iVar3;
  signature s;
  size_t sVar4;
  function_return v;
  type ptVar5;
  value pvVar6;
  serial s_00;
  size_t sVar7;
  value *ppvVar8;
  value *ppvVar9;
  value pvVar10;
  void *v_00;
  void *values [16];
  void *keys [16];
  type_id in_stack_fffffffffffffebc;
  value in_stack_fffffffffffffec8;
  void *local_b8 [17];
  
  if (func != (void *)0x0) {
    s = function_signature((function_conflict)func);
    if (buffer == (char *)0x0 || size == 0) {
      sVar4 = signature_count(s);
      if (sVar4 == 0) {
        v = function_call((function_conflict)func,metacall_null_args,0);
        if (v == (function_return)0x0) {
          return (void *)0x0;
        }
        ptVar5 = signature_get_return(s);
        if (ptVar5 == (type)0x0) {
          return v;
        }
        tVar1 = type_index(ptVar5);
        tVar2 = value_type_id(v);
        if (tVar1 == tVar2) {
          return v;
        }
        pvVar6 = value_type_cast(in_stack_fffffffffffffec8,in_stack_fffffffffffffebc);
        if (pvVar6 != (value)0x0) {
          return pvVar6;
        }
        return v;
      }
    }
    else {
      s_00 = serial_create("rapid_json");
      pvVar6 = serial_deserialize(s_00,buffer,size,(memory_allocator)allocator);
      if (pvVar6 != (value)0x0) {
        tVar1 = value_type_id(pvVar6);
        iVar3 = type_id_map(tVar1);
        if (iVar3 == 0) {
          sVar4 = signature_count(s);
          sVar7 = value_type_count(pvVar6);
          if (sVar4 == sVar7) {
            ppvVar8 = value_to_map(pvVar6);
            if (sVar4 == 0) {
              v_00 = metacallfmv(func,local_b8,(void **)&stack0xfffffffffffffec8);
            }
            else {
              sVar7 = 0;
              do {
                ppvVar9 = value_to_array(ppvVar8[sVar7]);
                pvVar10 = value_type_copy(*ppvVar9);
                local_b8[sVar7] = pvVar10;
                pvVar10 = value_type_copy(ppvVar9[1]);
                *(value *)(&stack0xfffffffffffffec8 + sVar7 * 8) = pvVar10;
                sVar7 = sVar7 + 1;
              } while (sVar4 != sVar7);
              v_00 = metacallfmv(func,local_b8,(void **)&stack0xfffffffffffffec8);
              sVar7 = 0;
              do {
                value_type_destroy(local_b8[sVar7]);
                value_type_destroy(*(value *)(&stack0xfffffffffffffec8 + sVar7 * 8));
                sVar7 = sVar7 + 1;
              } while (sVar4 != sVar7);
            }
            value_type_destroy(pvVar6);
            if (v_00 == (value)0x0) {
              return (void *)0x0;
            }
            ptVar5 = signature_get_return(s);
            if (ptVar5 == (type)0x0) {
              return v_00;
            }
            tVar1 = type_index(ptVar5);
            tVar2 = value_type_id(v_00);
            if (tVar1 != tVar2) {
              pvVar6 = value_type_cast(in_stack_fffffffffffffec8,in_stack_fffffffffffffebc);
              if (pvVar6 != (value)0x0) {
                return pvVar6;
              }
              return v_00;
            }
            return v_00;
          }
        }
        value_type_destroy(pvVar6);
      }
    }
  }
  return (void *)0x0;
}

Assistant:

void *metacallfms(void *func, const char *buffer, size_t size, void *allocator)
{
	function f = (function)func;

	if (f != NULL)
	{
		signature s = function_signature(f);

		if (buffer == NULL || size == 0)
		{
			if (signature_count(s) == 0)
			{
				value ret = function_call(f, metacall_null_args, 0);

				if (ret != NULL)
				{
					type t = signature_get_return(s);

					if (t != NULL)
					{
						type_id id = type_index(t);

						if (id != value_type_id(ret))
						{
							value cast_ret = value_type_cast(ret, id);

							return (cast_ret == NULL) ? ret : cast_ret;
						}
					}
				}

				return ret;
			}

			return NULL;
		}
		else
		{
			void *keys[METACALL_ARGS_SIZE];
			void *values[METACALL_ARGS_SIZE];

			value *v_map, ret, v = (value)metacall_deserialize(metacall_serial(), buffer, size, allocator);

			size_t iterator, args_count;

			if (v == NULL)
			{
				return NULL;
			}

			if (type_id_map(value_type_id(v)) != 0)
			{
				value_type_destroy(v);
				return NULL;
			}

			args_count = signature_count(s);

			/* TODO: No optional arguments allowed, review in the future */
			if (args_count != value_type_count(v))
			{
				value_type_destroy(v);
				return NULL;
			}

			v_map = value_to_map(v);

			for (iterator = 0; iterator < args_count; ++iterator)
			{
				value element = v_map[iterator];
				value *v_element = value_to_array(element);

				/* This step is necessary in order to handle type castings */
				keys[iterator] = value_type_copy(v_element[0]);
				values[iterator] = value_type_copy(v_element[1]);
			}

			ret = metacallfmv(f, keys, values);

			/* This step is necessary in order to handle type castings (otherwise it generates leaks) */
			for (iterator = 0; iterator < args_count; ++iterator)
			{
				value_type_destroy(keys[iterator]);
				value_type_destroy(values[iterator]);
			}

			value_type_destroy(v);

			if (ret != NULL)
			{
				type t = signature_get_return(s);

				if (t != NULL)
				{
					type_id id = type_index(t);

					if (id != value_type_id(ret))
					{
						value cast_ret = value_type_cast(ret, id);

						if (cast_ret != NULL)
						{
							ret = cast_ret;
						}
					}
				}
			}

			return ret;
		}
	}

	return NULL;
}